

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_message_tctable_lite.cc
# Opt level: O1

char * google::protobuf::internal::TcParser::FastGtS1
                 (MessageLite *msg,char *ptr,ParseContext *ctx,TcFieldData data,
                 TcParseTableBase *table,uint64_t hasbits)

{
  byte bVar1;
  uint32_t uVar2;
  long lVar3;
  long lVar4;
  bool bVar5;
  uint uVar6;
  MessageLite *pMVar7;
  ulong uVar8;
  ushort *puVar9;
  char *pcVar10;
  ushort *puVar11;
  Nonnull<const_char_*> failure_msg;
  uint *puVar12;
  TcParseTableBase *unaff_RBX;
  long *plVar13;
  Arena *arena;
  long v1;
  int iVar14;
  long v1_00;
  MessageLite *unaff_R15;
  LogMessageFatal local_50;
  uint32_t local_3c;
  long local_38;
  
  if (data.field_0._0_1_ != '\0') {
    pcVar10 = MiniParse(msg,ptr,ctx,data,table,hasbits);
    return pcVar10;
  }
  bVar1 = *ptr;
  if ((ulong)table->has_bits_offset != 0) {
    puVar12 = (uint *)((long)&msg->_vptr_MessageLite + (ulong)table->has_bits_offset);
    if (((ulong)puVar12 & 3) != 0) {
      AlignFail(puVar12);
    }
    *puVar12 = *puVar12 | (uint)hasbits | (uint)(1L << (data.field_0._2_1_ & 0x3f));
  }
  plVar13 = (long *)((long)&msg->_vptr_MessageLite + ((ulong)data.field_0 >> 0x30));
  if (((ulong)plVar13 & 7) != 0) {
    AlignFail(plVar13);
  }
  lVar3 = *(long *)((long)&table->has_bits_offset +
                   ((ulong)data.field_0 >> 0x18 & 0xff) * 8 + (ulong)table->aux_offset);
  if (*plVar13 == 0) {
    arena = (Arena *)(msg->_internal_metadata_).ptr_;
    if (((ulong)arena & 1) != 0) {
      arena = *(Arena **)((ulong)arena & 0xfffffffffffffffe);
    }
    pMVar7 = ClassData::New(*(ClassData **)(lVar3 + 0x20),arena);
    *plVar13 = (long)pMVar7;
  }
  iVar14 = ctx->depth_;
  local_38 = (long)iVar14 + -1;
  ctx->depth_ = (int)local_38;
  if ((long)iVar14 < 1) {
    puVar9 = (ushort *)0x0;
  }
  else {
    local_3c = (uint32_t)bVar1;
    local_50.super_LogMessage._0_8_ = ptr + 1;
    v1_00 = (long)ctx->group_depth_ + 1;
    iVar14 = (int)v1_00;
    ctx->group_depth_ = iVar14;
    lVar4 = *plVar13;
    while (bVar5 = EpsCopyInputStream::DoneWithCheck<false>
                             (&ctx->super_EpsCopyInputStream,(char **)&local_50,ctx->group_depth_),
          !bVar5) {
      uVar6 = (uint)*(byte *)(lVar3 + 8) & (uint)*(ushort *)local_50.super_LogMessage._0_8_;
      if ((uVar6 & 7) != 0) {
        protobuf_assumption_failed
                  ("(idx & 7) == 0",
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_message_tctable_impl.h"
                   ,0x452);
      }
      uVar8 = (ulong)(uVar6 & 0xfffffff8);
      local_50.super_LogMessage._0_8_ =
           (**(code **)(lVar3 + 0x38 + uVar8 * 2))
                     (lVar4,local_50.super_LogMessage._0_8_,ctx,
                      (ulong)*(ushort *)local_50.super_LogMessage._0_8_ ^
                      *(ulong *)(lVar3 + 0x40 + uVar8 * 2),lVar3,0);
      if (((ushort *)local_50.super_LogMessage._0_8_ == (ushort *)0x0) ||
         ((ctx->super_EpsCopyInputStream).last_tag_minus_1_ != 0)) break;
    }
    v1 = local_38;
    if ((*(byte *)(lVar3 + 9) & 1) == 0) {
      puVar11 = (ushort *)local_50.super_LogMessage._0_8_;
      if ((ushort *)local_50.super_LogMessage._0_8_ == (ushort *)0x0) {
        VerifyHasBitConsistency(unaff_R15,unaff_RBX);
        puVar11 = (ushort *)local_50.super_LogMessage._0_8_;
      }
    }
    else {
      puVar11 = (ushort *)(**(code **)(lVar3 + 0x28))(lVar4,local_50.super_LogMessage._0_8_,ctx);
      v1 = local_38;
    }
    if (puVar11 != (ushort *)0x0) {
      if ((int)v1 == ctx->depth_) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (v1,(long)ctx->depth_,"old_depth == depth_");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        iVar14 = 0x491;
LAB_0027d51e:
        absl::lts_20250127::log_internal::LogMessageFatal::LogMessageFatal
                  (&local_50,
                   "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/parse_context.h"
                   ,iVar14,failure_msg);
        absl::lts_20250127::log_internal::LogMessageFatal::~LogMessageFatal(&local_50);
      }
      if (iVar14 == ctx->group_depth_) {
        failure_msg = (Nonnull<const_char_*>)0x0;
      }
      else {
        failure_msg = absl::lts_20250127::log_internal::MakeCheckOpString<long,long>
                                (v1_00,(long)ctx->group_depth_,"old_group_depth == group_depth_");
      }
      if (failure_msg != (Nonnull<const_char_*>)0x0) {
        iVar14 = 0x492;
        goto LAB_0027d51e;
      }
    }
    ctx->group_depth_ = ctx->group_depth_ + -1;
    ctx->depth_ = ctx->depth_ + 1;
    uVar2 = (ctx->super_EpsCopyInputStream).last_tag_minus_1_;
    (ctx->super_EpsCopyInputStream).last_tag_minus_1_ = 0;
    puVar9 = (ushort *)0x0;
    if (uVar2 == local_3c) {
      puVar9 = puVar11;
    }
  }
  return (char *)puVar9;
}

Assistant:

PROTOBUF_NOINLINE const char* TcParser::FastGtS1(PROTOBUF_TC_PARAM_DECL) {
  PROTOBUF_MUSTTAIL return SingularParseMessageAuxImpl<uint8_t, true, true>(
      PROTOBUF_TC_PARAM_PASS);
}